

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::DoubleAPFloat::fusedMultiplyAdd
          (DoubleAPFloat *this,DoubleAPFloat *Multiplicand,DoubleAPFloat *Addend,roundingMode RM)

{
  APFloat *__ptr;
  opStatus oVar1;
  APFloat Tmp;
  undefined1 local_b0 [8];
  IEEEFloat local_a8;
  DoubleAPFloat local_90;
  anon_union_8_2_1313ab2f_for_U local_80;
  Storage local_78;
  DoubleAPFloat local_60;
  undefined1 local_50 [8];
  IEEEFloat local_48;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    bitcastToAPInt((DoubleAPFloat *)local_b0);
    IEEEFloat::IEEEFloat
              ((IEEEFloat *)(local_50 + 8),(fltSemantics *)semPPCDoubleDoubleLegacy,
               (APInt *)local_b0);
    if ((0x40 < (uint)local_a8.semantics) && (local_b0 != (undefined1  [8])0x0)) {
      operator_delete__((void *)local_b0);
    }
    bitcastToAPInt(&local_90);
    IEEEFloat::IEEEFloat
              ((IEEEFloat *)(local_b0 + 8),(fltSemantics *)semPPCDoubleDoubleLegacy,
               (APInt *)&local_90);
    bitcastToAPInt(&local_60);
    IEEEFloat::IEEEFloat(&local_78.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_60)
    ;
    oVar1 = APFloat::fusedMultiplyAdd
                      ((APFloat *)local_50,(APFloat *)local_b0,(APFloat *)&local_80,RM);
    APFloat::Storage::~Storage((Storage *)&local_78.IEEE);
    if ((0x40 < (uint)local_60.Floats._M_t.
                      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                      .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl) &&
       (local_60.Semantics != (fltSemantics *)0x0)) {
      operator_delete__(local_60.Semantics);
    }
    APFloat::Storage::~Storage((Storage *)(local_b0 + 8));
    if ((0x40 < (uint)local_90.Floats._M_t.
                      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                      .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl) &&
       (local_90.Semantics != (fltSemantics *)0x0)) {
      operator_delete__(local_90.Semantics);
    }
    APFloat::bitcastToAPInt((APFloat *)&local_80);
    DoubleAPFloat((DoubleAPFloat *)local_b0,(fltSemantics *)semPPCDoubleDouble,(APInt *)&local_80);
    if ((DoubleAPFloat *)local_b0 != this) {
      __ptr = (this->Floats)._M_t.
              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
              super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      if (__ptr != (APFloat *)0x0) {
        std::default_delete<llvm::APFloat[]>::operator()
                  ((default_delete<llvm::APFloat[]> *)&this->Floats,__ptr);
      }
      (this->Floats)._M_t.
      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
      super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)0x0;
      DoubleAPFloat(this,(DoubleAPFloat *)local_b0);
    }
    if (local_a8.semantics != (fltSemantics *)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)(local_b0 + 8),(APFloat *)local_a8.semantics);
    }
    local_a8.semantics = (fltSemantics *)0x0;
    if ((0x40 < (uint)local_78._0_4_) && ((void *)local_80.VAL != (void *)0x0)) {
      operator_delete__(local_80.pVal);
    }
    APFloat::Storage::~Storage((Storage *)(local_50 + 8));
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1048,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::fusedMultiplyAdd(const DoubleAPFloat &, const DoubleAPFloat &, APFloat::roundingMode)"
               );
}

Assistant:

APFloat::opStatus
DoubleAPFloat::fusedMultiplyAdd(const DoubleAPFloat &Multiplicand,
                                const DoubleAPFloat &Addend,
                                APFloat::roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret = Tmp.fusedMultiplyAdd(
      APFloat(semPPCDoubleDoubleLegacy, Multiplicand.bitcastToAPInt()),
      APFloat(semPPCDoubleDoubleLegacy, Addend.bitcastToAPInt()), RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}